

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkLatchSweep(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pFanin;
  int iVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  
  pVVar3 = pNtk->vBoxes;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    plVar6 = (long *)0x0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar5];
      plVar7 = plVar6;
      if (((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) &&
         (iVar2 = Abc_NtkCheckConstant_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[4] * 8)), iVar2 != -1)) {
        if (iVar2 == 0) {
LAB_00316ae4:
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
          }
          if (plVar1[7] != 2) goto LAB_00316b23;
LAB_00316ba5:
          plVar7 = plVar1;
          if (plVar6 == (long *)0x0) goto LAB_00316b8f;
          if (((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) ||
             ((*(uint *)((long)plVar6 + 0x14) & 0xf) != 8)) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1ab,"int Abc_LatchInit(Abc_Obj_t *)");
          }
          pFanin = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[6] * 8);
          if ((int)plVar1[7] != (int)plVar6[7]) {
            pFanin = Abc_NtkCreateNodeInv(pNtk,pFanin);
          }
        }
        else {
          if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1a8,"int Abc_LatchIsInit0(Abc_Obj_t *)");
          }
          if (plVar1[7] == 1) goto LAB_00316ba5;
          if (iVar2 == 0) goto LAB_00316ae4;
LAB_00316b23:
          plVar7 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8
                             );
          pFanin = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8);
        }
        Abc_ObjTransferFanout
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8),pFanin)
        ;
        Abc_NtkDeleteObj_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8),0);
        iVar4 = iVar4 + 1;
        plVar7 = plVar6;
      }
LAB_00316b8f:
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vBoxes;
      plVar6 = plVar7;
    } while (lVar5 < pVVar3->nSize);
  }
  return iVar4;
}

Assistant:

int Abc_NtkLatchSweep( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pFanin, * pLatch, * pLatchPivot = NULL;
    int Counter, RetValue, i;
    Counter = 0;
    // go through the latches
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        // check if the latch has constant input
        RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pLatch) );
        if ( RetValue == -1 )
            continue;
        // found a latch with constant fanin
        if ( (RetValue == 1 && Abc_LatchIsInit0(pLatch)) ||
             (RetValue == 0 && Abc_LatchIsInit1(pLatch)) )
        {
            // fanin constant differs from the latch init value
            if ( pLatchPivot == NULL )
            {
                pLatchPivot = pLatch;
                continue;
            }
            if ( Abc_LatchInit(pLatch) != Abc_LatchInit(pLatchPivot) ) // add inverter
                pFanin = Abc_NtkCreateNodeInv( pNtk, Abc_ObjFanout0(pLatchPivot) );
            else
                pFanin = Abc_ObjFanout0(pLatchPivot);
        }
        else
            pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
        // replace latch
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pFanin );
        // delete the extra nodes
        Abc_NtkDeleteObj_rec( Abc_ObjFanout0(pLatch), 0 );
        Counter++;
    }
    return Counter;
}